

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int parse_object(frozen *f)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *ptr;
  
  iVar2 = test_and_skip(f,0x7b);
  if ((-1 < iVar2) && (iVar2 = capture_ptr(f,f->cur + -1,JSON_TYPE_OBJECT), -1 < iVar2)) {
    iVar1 = f->num_tokens;
    while (iVar2 = cur(f), iVar2 != 0x7d) {
      uVar3 = cur(f);
      if ((uVar3 & 0xffffffdf) - 0x5b < 0xffffffe6) {
        if (uVar3 != 0x22) {
          return ~(uint)(uVar3 == 0xffffffff);
        }
        iVar2 = parse_string(f);
        if (iVar2 < 0) {
          return iVar2;
        }
      }
      else {
        uVar3 = cur(f);
        if ((uVar3 & 0xffffffdf) - 0x5b < 0xffffffe6) {
          return -1;
        }
        iVar2 = capture_ptr(f,f->cur,JSON_TYPE_STRING);
        if (iVar2 < 0) {
          return iVar2;
        }
        ptr = f->cur;
        while ((ptr < f->end &&
               ((uVar3 = (uint)*ptr, uVar3 == 0x5f ||
                (0xffffffe5 < (uVar3 & 0xffffffdf) - 0x5b || 0xfffffff5 < uVar3 - 0x3a))))) {
          ptr = ptr + 1;
          f->cur = ptr;
        }
        capture_len(f,f->num_tokens + -1,ptr);
      }
      iVar2 = test_and_skip(f,0x3a);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar2 = parse_value(f);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar2 = cur(f);
      if (iVar2 == 0x2c) {
        f->cur = f->cur + 1;
      }
    }
    iVar2 = test_and_skip(f,0x7d);
    if (-1 < iVar2) {
      capture_len(f,iVar1 + -1,f->cur);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int parse_object(struct frozen *f) {
    int ind;
    TRY(test_and_skip(f, '{'));
    TRY(capture_ptr(f, f->cur - 1, JSON_TYPE_OBJECT));
    ind = f->num_tokens - 1;
    while (cur(f) != '}') {
        TRY(parse_pair(f));
        if (cur(f) == ',') f->cur++;
    }
    TRY(test_and_skip(f, '}'));
    capture_len(f, ind, f->cur);
    return 0;
}